

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::DeathTestThreadWarning_abi_cxx11_(size_t thread_count)

{
  Message *this;
  Message *this_00;
  Message *val;
  long in_RSI;
  string *in_RDI;
  Message msg;
  char (*in_stack_ffffffffffffff98) [53];
  Message *in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffd0;
  
  Message::Message(in_stack_ffffffffffffffd0);
  Message::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [40])in_stack_ffffffffffffff98);
  this = Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [12])in_stack_ffffffffffffff98);
  Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [2])in_stack_ffffffffffffff98);
  if (in_RSI == 0) {
    Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [39])in_stack_ffffffffffffff98);
  }
  else {
    this_00 = Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [10])in_stack_ffffffffffffff98
                                 );
    val = Message::operator<<(this_00,(unsigned_long *)in_stack_ffffffffffffff98);
    Message::operator<<(this_00,(char (*) [10])val);
  }
  Message::GetString_abi_cxx11_(this);
  Message::~Message((Message *)0x11f718);
  return in_RDI;
}

Assistant:

static std::string DeathTestThreadWarning(size_t thread_count) {
  Message msg;
  msg << "Death tests use fork(), which is unsafe particularly"
      << " in a threaded context. For this test, " << GTEST_NAME_ << " ";
  if (thread_count == 0)
    msg << "couldn't detect the number of threads.";
  else
    msg << "detected " << thread_count << " threads.";
  return msg.GetString();
}